

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

bool __thiscall ArgsManager::IsArgNegated(ArgsManager *this,string *strArg)

{
  bool bVar1;
  long in_FS_OFFSET;
  SettingsValue SStack_68;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  GetSetting(&SStack_68,this,strArg);
  bVar1 = UniValue::isFalse(&SStack_68);
  UniValue::~UniValue(&SStack_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::IsArgNegated(const std::string& strArg) const
{
    return GetSetting(strArg).isFalse();
}